

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::emit_store_statement
          (CompilerMSL *this,uint32_t lhs_expression,uint32_t rhs_expression)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  uint32_t id;
  uint uVar4;
  SPIRType *pSVar5;
  SPIRExpression *pSVar6;
  SPIRType *pSVar7;
  SPIRVariable *pSVar8;
  SPIRType *type;
  string *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  char *in_R8;
  char *in_R9;
  char (*pacVar11) [3];
  char (*pacVar12) [2];
  uint local_398;
  uint local_394;
  SPIRExpression *local_390;
  undefined4 local_384;
  SPIRExpression *local_380;
  string rhs_row;
  string unpacked_expr;
  char *packed_pfx;
  string cast_expr;
  string cast_addr_space;
  string local_2f0;
  SPIRType vector_type;
  SPIRType write_type;
  
  pSVar5 = Compiler::expression_type((Compiler *)this,rhs_expression);
  bVar1 = Compiler::has_extended_decoration
                    ((Compiler *)this,lhs_expression,SPIRVCrossDecorationPhysicalTypeID);
  bVar2 = Compiler::has_extended_decoration
                    ((Compiler *)this,lhs_expression,SPIRVCrossDecorationPhysicalTypePacked);
  pSVar6 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,lhs_expression);
  local_380 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,rhs_expression);
  if (pSVar6 == (SPIRExpression *)0x0) {
    bVar3 = 0;
  }
  else {
    bVar3 = pSVar6->need_transpose;
  }
  local_390 = pSVar6;
  if (!bVar1 && !bVar2) {
    bVar1 = Compiler::is_matrix((Compiler *)this,pSVar5);
    if ((local_390 == (SPIRExpression *)0x0) || (!bVar1)) {
      if (local_390 == (SPIRExpression *)0x0) goto LAB_002edd9d;
      bVar3 = local_390->need_transpose;
    }
    else {
      bVar3 = local_390->need_transpose;
      if ((bool)bVar3 == true) {
        local_390->need_transpose = false;
        if ((local_380 == (SPIRExpression *)0x0) || (local_380->need_transpose != true)) {
          CompilerGLSL::to_expression_abi_cxx11_
                    ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
          CompilerGLSL::to_unpacked_expression_abi_cxx11_
                    ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
          CompilerGLSL::
          statement<std::__cxx11::string,char_const(&)[14],std::__cxx11::string,char_const(&)[3]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &write_type,(char (*) [14])" = transpose(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [3])0x37e4de);
          ::std::__cxx11::string::~string((string *)&vector_type);
          ::std::__cxx11::string::~string((string *)&write_type);
        }
        else {
          local_380->need_transpose = false;
          CompilerGLSL::to_expression_abi_cxx11_
                    ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
          CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                    ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression);
          CompilerGLSL::
          statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &write_type,(char (*) [4])0x395f16,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [2])0x37e4df);
          ::std::__cxx11::string::~string((string *)&vector_type);
          ::std::__cxx11::string::~string((string *)&write_type);
          local_380->need_transpose = true;
        }
        local_390->need_transpose = true;
        goto LAB_002ee141;
      }
    }
    if ((bVar3 & 1) != 0) {
      local_390->need_transpose = false;
      uVar4 = 0;
      while( true ) {
        cast_expr._M_dataplus._M_p._0_4_ = uVar4;
        if (pSVar5->vecsize <= uVar4) break;
        CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                  ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
        psVar9 = (string *)::std::__cxx11::string::rfind((char)&write_type,0x5b);
        if (psVar9 != (string *)0xffffffffffffffff) {
          rhs_row._M_dataplus._M_p._0_1_ = 0x5b;
          unpacked_expr._M_dataplus._M_p._0_1_ = 0x5d;
          join<char,unsigned_int&,char>
                    ((string *)&vector_type,(spirv_cross *)&rhs_row,(char *)&cast_expr,
                     (uint *)&unpacked_expr,in_R8);
          pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ::std::__cxx11::string::insert((ulong)&write_type,psVar9);
          CompilerGLSL::to_extract_component_expression_abi_cxx11_
                    (&cast_addr_space,&this->super_CompilerGLSL,rhs_expression,
                     (uint)cast_expr._M_dataplus._M_p);
          in_R8 = ";";
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,pbVar10,(char (*) [4])0x395f16,&cast_addr_space,
                     (char (*) [2])0x37e4df);
          ::std::__cxx11::string::~string((string *)&cast_addr_space);
          ::std::__cxx11::string::~string((string *)&vector_type);
        }
        ::std::__cxx11::string::~string((string *)&write_type);
        uVar4 = (uint)cast_expr._M_dataplus._M_p + 1;
      }
      local_390->need_transpose = true;
LAB_002ee141:
      Compiler::register_write((Compiler *)this,lhs_expression);
      return;
    }
LAB_002edd9d:
    CompilerGLSL::emit_store_statement(&this->super_CompilerGLSL,lhs_expression,rhs_expression);
    return;
  }
  if (bVar1) {
    id = Compiler::get_extended_decoration
                   ((Compiler *)this,lhs_expression,SPIRVCrossDecorationPhysicalTypeID);
  }
  else {
    bVar1 = Compiler::is_matrix((Compiler *)this,pSVar5);
    if (!bVar1 && (bVar3 & 1) == 0) goto LAB_002edd9d;
    id = (pSVar5->super_IVariant).self.id;
  }
  pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
  ::std::__cxx11::string::string((string *)&cast_addr_space,"thread",(allocator *)&write_type);
  pSVar8 = Compiler::maybe_get_backing_variable((Compiler *)this,lhs_expression);
  if (pSVar8 != (SPIRVariable *)0x0) {
    type = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(pSVar8->super_IVariant).field_0xc);
    get_type_address_space_abi_cxx11_((string *)&write_type,this,type,lhs_expression,false);
    ::std::__cxx11::string::operator=((string *)&cast_addr_space,(string *)&write_type);
    ::std::__cxx11::string::~string((string *)&write_type);
  }
  bVar1 = Compiler::is_matrix((Compiler *)this,pSVar5);
  if (bVar1) {
    packed_pfx = "";
    if (bVar2) {
      packed_pfx = "packed_";
    }
    if (local_380 == (SPIRExpression *)0x0) {
      local_384 = 0;
    }
    else {
      local_384 = (undefined4)CONCAT71((int7)((ulong)local_380 >> 8),local_380->need_transpose);
    }
    SPIRType::SPIRType(&write_type,pSVar5);
    cast_expr._M_dataplus._M_p = (pointer)&cast_expr.field_2;
    cast_expr._M_string_length = 0;
    cast_expr.field_2._M_local_buf[0] = '\0';
    if ((char)local_384 != '\0') {
      local_380->need_transpose = false;
    }
    if (bVar3 == 0) {
      write_type.columns = 1;
      if (pSVar7->vecsize != pSVar5->vecsize) {
        pacVar11 = (char (*) [3])0x2ee336;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&rhs_row,this,&write_type,0);
        join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string,char_const(&)[3]>
                  ((string *)&vector_type,(spirv_cross *)0x3965df,(char (*) [2])&cast_addr_space,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37fb8c,
                   (char (*) [2])&packed_pfx,(char **)&rhs_row,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37eae2,
                   pacVar11);
        ::std::__cxx11::string::operator=((string *)&cast_expr,(string *)&vector_type);
        ::std::__cxx11::string::~string((string *)&vector_type);
        ::std::__cxx11::string::~string((string *)&rhs_row);
      }
      if ((char)local_384 == '\0') {
        for (unpacked_expr._M_dataplus._M_p._0_4_ = 0;
            (uint)unpacked_expr._M_dataplus._M_p < pSVar5->columns;
            unpacked_expr._M_dataplus._M_p._0_4_ = (uint)unpacked_expr._M_dataplus._M_p + 1) {
          CompilerGLSL::to_enclosed_expression_abi_cxx11_
                    ((string *)&vector_type,&this->super_CompilerGLSL,lhs_expression,true);
          CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                    (&rhs_row,&this->super_CompilerGLSL,rhs_expression,true);
          CompilerGLSL::
          statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                    (&this->super_CompilerGLSL,&cast_expr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [2])0x37d448,(uint *)&unpacked_expr,
                     (char (*) [2])0x3759d6,(char (*) [4])0x395f16,&rhs_row,(char (*) [2])0x37d448,
                     (uint *)&unpacked_expr,(char (*) [3])0x381d96);
          ::std::__cxx11::string::~string((string *)&rhs_row);
          ::std::__cxx11::string::~string((string *)&vector_type);
        }
      }
      else {
        pSVar7 = Compiler::expression_type((Compiler *)this,rhs_expression);
        SPIRType::SPIRType(&vector_type,pSVar7);
        vector_type.columns = 1;
        for (local_394 = 0; local_394 < pSVar5->columns; local_394 = local_394 + 1) {
          CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                    (&unpacked_expr,&this->super_CompilerGLSL,&vector_type);
          ::std::operator+(&rhs_row,&unpacked_expr,"(");
          ::std::__cxx11::string::~string((string *)&unpacked_expr);
          for (local_398 = 0; local_398 < vector_type.vecsize; local_398 = local_398 + 1) {
            pacVar12 = (char (*) [2])0x2ee45e;
            CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                      (&unpacked_expr,&this->super_CompilerGLSL,rhs_expression);
            join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                      (&local_2f0,(spirv_cross *)&unpacked_expr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37d448
                       ,(char (*) [2])&local_398,(uint *)"][",(char (*) [3])&local_394,
                       (uint *)0x3759d6,pacVar12);
            ::std::__cxx11::string::append((string *)&rhs_row);
            ::std::__cxx11::string::~string((string *)&local_2f0);
            if (local_398 + 1 < vector_type.vecsize) {
              ::std::__cxx11::string::append((char *)&rhs_row);
            }
            ::std::__cxx11::string::~string((string *)&unpacked_expr);
          }
          ::std::__cxx11::string::append((char *)&rhs_row);
          CompilerGLSL::to_enclosed_expression_abi_cxx11_
                    (&unpacked_expr,&this->super_CompilerGLSL,lhs_expression,true);
          CompilerGLSL::
          statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,&cast_expr,&unpacked_expr,(char (*) [2])0x37d448,
                     &local_394,(char (*) [2])0x3759d6,(char (*) [4])0x395f16,&rhs_row,
                     (char (*) [2])0x37e4df);
          ::std::__cxx11::string::~string((string *)&unpacked_expr);
          ::std::__cxx11::string::~string((string *)&rhs_row);
        }
        SPIRType::~SPIRType(&vector_type);
      }
    }
    else {
      local_390->need_transpose = false;
      write_type.columns = 1;
      write_type.vecsize = pSVar5->columns;
      if (pSVar7->columns != pSVar5->columns) {
        pacVar11 = (char (*) [3])0x2ee1dd;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&rhs_row,this,&write_type,0);
        join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string,char_const(&)[3]>
                  ((string *)&vector_type,(spirv_cross *)0x3965df,(char (*) [2])&cast_addr_space,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37fb8c,
                   (char (*) [2])&packed_pfx,(char **)&rhs_row,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37eae2,
                   pacVar11);
        ::std::__cxx11::string::operator=((string *)&cast_expr,(string *)&vector_type);
        ::std::__cxx11::string::~string((string *)&vector_type);
        ::std::__cxx11::string::~string((string *)&rhs_row);
      }
      if ((char)local_384 == '\0') {
        pSVar7 = Compiler::expression_type((Compiler *)this,rhs_expression);
        SPIRType::SPIRType(&vector_type,pSVar7);
        vector_type.vecsize = vector_type.columns;
        vector_type.columns = 1;
        for (local_394 = 0; local_394 < pSVar5->vecsize; local_394 = local_394 + 1) {
          CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                    (&unpacked_expr,&this->super_CompilerGLSL,&vector_type);
          ::std::operator+(&rhs_row,&unpacked_expr,"(");
          ::std::__cxx11::string::~string((string *)&unpacked_expr);
          uVar4 = 0;
          while (local_398 = uVar4, uVar4 < vector_type.vecsize) {
            pacVar12 = (char (*) [2])0x2ee6b3;
            CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                      (&local_2f0,&this->super_CompilerGLSL,rhs_expression,true);
            join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                      (&unpacked_expr,(spirv_cross *)&local_2f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37d448
                       ,(char (*) [2])&local_398,(uint *)"][",(char (*) [3])&local_394,
                       (uint *)0x3759d6,pacVar12);
            ::std::__cxx11::string::append((string *)&rhs_row);
            ::std::__cxx11::string::~string((string *)&unpacked_expr);
            ::std::__cxx11::string::~string((string *)&local_2f0);
            uVar4 = local_398 + 1;
            if (uVar4 < vector_type.vecsize) {
              ::std::__cxx11::string::append((char *)&rhs_row);
              uVar4 = local_398 + 1;
            }
          }
          ::std::__cxx11::string::append((char *)&rhs_row);
          CompilerGLSL::to_enclosed_expression_abi_cxx11_
                    (&unpacked_expr,&this->super_CompilerGLSL,lhs_expression,true);
          CompilerGLSL::
          statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,&cast_expr,&unpacked_expr,(char (*) [2])0x37d448,
                     &local_394,(char (*) [2])0x3759d6,(char (*) [4])0x395f16,&rhs_row,
                     (char (*) [2])0x37e4df);
          ::std::__cxx11::string::~string((string *)&unpacked_expr);
          ::std::__cxx11::string::~string((string *)&rhs_row);
        }
        SPIRType::~SPIRType(&vector_type);
      }
      else {
        for (unpacked_expr._M_dataplus._M_p._0_4_ = 0;
            (uint)unpacked_expr._M_dataplus._M_p < pSVar5->vecsize;
            unpacked_expr._M_dataplus._M_p._0_4_ = (uint)unpacked_expr._M_dataplus._M_p + 1) {
          CompilerGLSL::to_enclosed_expression_abi_cxx11_
                    ((string *)&vector_type,&this->super_CompilerGLSL,lhs_expression,true);
          CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                    (&rhs_row,&this->super_CompilerGLSL,rhs_expression);
          CompilerGLSL::
          statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                    (&this->super_CompilerGLSL,&cast_expr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [2])0x37d448,(uint *)&unpacked_expr,
                     (char (*) [2])0x3759d6,(char (*) [4])0x395f16,&rhs_row,(char (*) [2])0x37d448,
                     (uint *)&unpacked_expr,(char (*) [3])0x381d96);
          ::std::__cxx11::string::~string((string *)&rhs_row);
          ::std::__cxx11::string::~string((string *)&vector_type);
        }
      }
      local_390->need_transpose = true;
    }
    if ((char)local_384 != '\0') {
      local_380->need_transpose = true;
    }
    ::std::__cxx11::string::~string((string *)&cast_expr);
  }
  else {
    if (bVar3 == 0) {
      bVar1 = Compiler::is_matrix((Compiler *)this,pSVar7);
      if (((bVar1) || (bVar1 = Compiler::is_array((Compiler *)this,pSVar7), bVar1)) &&
         (pSVar5->vecsize < pSVar7->vecsize)) {
        if (2 < pSVar5->vecsize - 1) {
          __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1357,
                        "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                       );
        }
        if (bVar2) {
          __assert_fail("!lhs_packed_type",
                        "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x135d,
                        "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                       );
        }
        CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                  ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
        CompilerGLSL::to_pointer_expression_abi_cxx11_
                  ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&rhs_row,this,pSVar5,0);
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2edff8;
        CompilerGLSL::enclose_expression
                  (&unpacked_expr,&this->super_CompilerGLSL,(string *)&write_type);
        join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string>
                  (&cast_expr,(spirv_cross *)0x3965df,(char (*) [2])&cast_addr_space,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37fb8c,
                   (char (*) [2])&rhs_row,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37eae2,
                   (char (*) [3])&unpacked_expr,pbVar10);
        ::std::__cxx11::string::operator=((string *)&write_type,(string *)&cast_expr);
        ::std::__cxx11::string::~string((string *)&cast_expr);
        ::std::__cxx11::string::~string((string *)&unpacked_expr);
        ::std::__cxx11::string::~string((string *)&rhs_row);
        pSVar5 = Compiler::expression_type((Compiler *)this,rhs_expression);
        bVar1 = CompilerGLSL::optimize_read_modify_write
                          (&this->super_CompilerGLSL,pSVar5,(string *)&write_type,
                           (string *)&vector_type);
        if (!bVar1) {
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &write_type,(char (*) [4])0x395f16,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [2])0x37e4df);
        }
      }
      else {
        bVar1 = Compiler::is_matrix((Compiler *)this,pSVar5);
        if (bVar1) goto LAB_002ee89c;
        CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                  ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
        CompilerGLSL::to_pointer_expression_abi_cxx11_
                  ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
        pSVar5 = Compiler::expression_type((Compiler *)this,rhs_expression);
        bVar1 = CompilerGLSL::optimize_read_modify_write
                          (&this->super_CompilerGLSL,pSVar5,(string *)&write_type,
                           (string *)&vector_type);
        if (!bVar1) {
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &write_type,(char (*) [4])0x395f16,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [2])0x37e4df);
        }
      }
      ::std::__cxx11::string::~string((string *)&vector_type);
      ::std::__cxx11::string::~string((string *)&write_type);
      goto LAB_002ee89c;
    }
    local_390->need_transpose = false;
    SPIRType::SPIRType(&write_type,pSVar5);
    write_type.vecsize = 1;
    write_type.columns = 1;
    for (local_2f0._M_dataplus._M_p._0_4_ = 0; (uint)local_2f0._M_dataplus._M_p < pSVar5->vecsize;
        local_2f0._M_dataplus._M_p._0_4_ = (uint)local_2f0._M_dataplus._M_p + 1) {
      CompilerGLSL::to_enclosed_expression_abi_cxx11_
                ((string *)&vector_type,&this->super_CompilerGLSL,lhs_expression,true);
      psVar9 = (string *)::std::__cxx11::string::rfind((char)&vector_type,0x5b);
      if (psVar9 != (string *)0xffffffffffffffff) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&cast_expr,this,&write_type,0);
        packed_pfx = (char *)CONCAT71(packed_pfx._1_7_,0x5b);
        local_394 = CONCAT31(local_394._1_3_,0x5d);
        join<char,unsigned_int&,char,char_const(&)[2]>
                  (&rhs_row,(spirv_cross *)&packed_pfx,(char *)&local_2f0,&local_394,")",
                   (char (*) [2])in_R9);
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ::std::__cxx11::string::insert((ulong)&vector_type,psVar9);
        CompilerGLSL::to_extract_component_expression_abi_cxx11_
                  (&unpacked_expr,&this->super_CompilerGLSL,rhs_expression,
                   (uint)local_2f0._M_dataplus._M_p);
        in_R9 = "*)&";
        CompilerGLSL::
        statement<char_const(&)[3],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [3])0x389683,&cast_addr_space,
                   (char (*) [2])0x37fb8c,&cast_expr,(char (*) [4])"*)&",pbVar10,
                   (char (*) [4])0x395f16,&unpacked_expr,(char (*) [2])0x37e4df);
        ::std::__cxx11::string::~string((string *)&unpacked_expr);
        ::std::__cxx11::string::~string((string *)&rhs_row);
        ::std::__cxx11::string::~string((string *)&cast_expr);
      }
      ::std::__cxx11::string::~string((string *)&vector_type);
    }
    local_390->need_transpose = true;
  }
  SPIRType::~SPIRType(&write_type);
LAB_002ee89c:
  Compiler::register_write((Compiler *)this,lhs_expression);
  ::std::__cxx11::string::~string((string *)&cast_addr_space);
  return;
}

Assistant:

void CompilerMSL::emit_store_statement(uint32_t lhs_expression, uint32_t rhs_expression)
{
	auto &type = expression_type(rhs_expression);

	bool lhs_remapped_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID);
	bool lhs_packed_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypePacked);
	auto *lhs_e = maybe_get<SPIRExpression>(lhs_expression);
	auto *rhs_e = maybe_get<SPIRExpression>(rhs_expression);

	bool transpose = lhs_e && lhs_e->need_transpose;

	// No physical type remapping, and no packed type, so can just emit a store directly.
	if (!lhs_remapped_type && !lhs_packed_type)
	{
		// We might not be dealing with remapped physical types or packed types,
		// but we might be doing a clean store to a row-major matrix.
		// In this case, we just flip transpose states, and emit the store, a transpose must be in the RHS expression, if any.
		if (is_matrix(type) && lhs_e && lhs_e->need_transpose)
		{
			lhs_e->need_transpose = false;

			if (rhs_e && rhs_e->need_transpose)
			{
				// Direct copy, but might need to unpack RHS.
				// Skip the transpose, as we will transpose when writing to LHS and transpose(transpose(T)) == T.
				rhs_e->need_transpose = false;
				statement(to_expression(lhs_expression), " = ", to_unpacked_row_major_matrix_expression(rhs_expression),
				          ";");
				rhs_e->need_transpose = true;
			}
			else
				statement(to_expression(lhs_expression), " = transpose(", to_unpacked_expression(rhs_expression), ");");

			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else if (lhs_e && lhs_e->need_transpose)
		{
			lhs_e->need_transpose = false;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_dereferenced_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');
				if (column_index != string::npos)
				{
					statement(lhs_expr.insert(column_index, join('[', c, ']')), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}
			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else
			CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else if (!lhs_remapped_type && !is_matrix(type) && !transpose)
	{
		// Even if the target type is packed, we can directly store to it. We cannot store to packed matrices directly,
		// since they are declared as array of vectors instead, and we need the fallback path below.
		CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else
	{
		// Special handling when storing to a remapped physical type.
		// This is mostly to deal with std140 padded matrices or vectors.

		TypeID physical_type_id = lhs_remapped_type ?
		                              ID(get_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID)) :
		                              type.self;

		auto &physical_type = get<SPIRType>(physical_type_id);

		string cast_addr_space = "thread";
		auto *p_var_lhs = maybe_get_backing_variable(lhs_expression);
		if (p_var_lhs)
			cast_addr_space = get_type_address_space(get<SPIRType>(p_var_lhs->basetype), lhs_expression);

		if (is_matrix(type))
		{
			const char *packed_pfx = lhs_packed_type ? "packed_" : "";

			// Packed matrices are stored as arrays of packed vectors, so we need
			// to assign the vectors one at a time.
			// For row-major matrices, we need to transpose the *right-hand* side,
			// not the left-hand side.

			// Lots of cases to cover here ...

			bool rhs_transpose = rhs_e && rhs_e->need_transpose;
			SPIRType write_type = type;
			string cast_expr;

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = false;

			if (transpose)
			{
				// We're dealing with transpose manually.
				lhs_e->need_transpose = false;
				write_type.vecsize = type.columns;
				write_type.columns = 1;

				if (physical_type.columns != type.columns)
					cast_expr = join("(", cast_addr_space, " ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					// If RHS is also transposed, we can just copy row by row.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_unpacked_row_major_matrix_expression(rhs_expression), "[", i, "];");
					}
				}
				else
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.vecsize = vector_type.columns;
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							rhs_row += join(to_enclosed_unpacked_expression(rhs_expression), "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}

				// We're dealing with transpose manually.
				lhs_e->need_transpose = true;
			}
			else
			{
				write_type.columns = 1;

				if (physical_type.vecsize != type.vecsize)
					cast_expr = join("(", cast_addr_space, " ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							// Need to explicitly unpack expression since we've mucked with transpose state.
							auto unpacked_expr = to_unpacked_row_major_matrix_expression(rhs_expression);
							rhs_row += join(unpacked_expr, "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}
				else
				{
					// Copy column-by-column.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_enclosed_unpacked_expression(rhs_expression), "[", i, "];");
					}
				}
			}

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = true;
		}
		else if (transpose)
		{
			lhs_e->need_transpose = false;

			SPIRType write_type = type;
			write_type.vecsize = 1;
			write_type.columns = 1;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_enclosed_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');
				if (column_index != string::npos)
				{
					statement("((", cast_addr_space, " ", type_to_glsl(write_type), "*)&",
					          lhs_expr.insert(column_index, join('[', c, ']', ")")), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}

			lhs_e->need_transpose = true;
		}
		else if ((is_matrix(physical_type) || is_array(physical_type)) && physical_type.vecsize > type.vecsize)
		{
			assert(type.vecsize >= 1 && type.vecsize <= 3);

			// If we have packed types, we cannot use swizzled stores.
			// We could technically unroll the store for each element if needed.
			// When remapping to a std140 physical type, we always get float4,
			// and the packed decoration should always be removed.
			assert(!lhs_packed_type);

			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);

			// Unpack the expression so we can store to it with a float or float2.
			// It's still an l-value, so it's fine. Most other unpacking of expressions turn them into r-values instead.
			lhs = join("(", cast_addr_space, " ", type_to_glsl(type), "&)", enclose_expression(lhs));
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}
		else if (!is_matrix(type))
		{
			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}

		register_write(lhs_expression);
	}
}